

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmpset.cpp
# Opt level: O3

void __thiscall icu_63::BMPSet::overrideIllegal(BMPSet *this)

{
  uint32_t *puVar1;
  uint32_t *puVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  
  if (this->containsFFFD == '\0') {
    lVar7 = 0;
    do {
      puVar1 = this->bmpBlockBits + lVar7 + 0x20;
      uVar3 = puVar1[1];
      uVar4 = puVar1[2];
      uVar5 = puVar1[3];
      puVar2 = this->bmpBlockBits + lVar7 + 0x20;
      *puVar2 = *puVar1 & 0xdfffdfff;
      puVar2[1] = uVar3 & 0xdfffdfff;
      puVar2[2] = uVar4 & 0xdfffdfff;
      puVar2[3] = uVar5 & 0xdfffdfff;
      lVar7 = lVar7 + 4;
    } while (lVar7 != 0x20);
  }
  else {
    lVar7 = 0;
    do {
      uVar6 = *(ulong *)(this->table7FF + lVar7 + 2);
      *(ulong *)(this->table7FF + lVar7) = *(ulong *)(this->table7FF + lVar7) | 0x300000003;
      *(ulong *)(this->table7FF + lVar7 + 2) = uVar6 | 0x300000003;
      lVar7 = lVar7 + 4;
    } while (lVar7 != 0x40);
    lVar7 = 0;
    do {
      uVar6 = *(ulong *)(this->bmpBlockBits + lVar7 + 2);
      *(ulong *)(this->bmpBlockBits + lVar7) = *(ulong *)(this->bmpBlockBits + lVar7) | 0x100000001;
      *(ulong *)(this->bmpBlockBits + lVar7 + 2) = uVar6 | 0x100000001;
      lVar7 = lVar7 + 4;
    } while (lVar7 != 0x20);
    lVar7 = 0;
    do {
      puVar1 = this->bmpBlockBits + lVar7 + 0x20;
      uVar3 = puVar1[1];
      uVar4 = puVar1[2];
      uVar5 = puVar1[3];
      puVar2 = this->bmpBlockBits + lVar7 + 0x20;
      *puVar2 = *puVar1 & 0xdfffdfff | 0x2000;
      puVar2[1] = uVar3 & 0xdfffdfff | 0x2000;
      puVar2[2] = uVar4 & 0xdfffdfff | 0x2000;
      puVar2[3] = uVar5 & 0xdfffdfff | 0x2000;
      lVar7 = lVar7 + 4;
    } while (lVar7 != 0x20);
  }
  return;
}

Assistant:

void BMPSet::overrideIllegal() {
    uint32_t bits, mask;
    int32_t i;

    if(containsFFFD) {
        bits=3;                 // Lead bytes 0xC0 and 0xC1.
        for(i=0; i<64; ++i) {
            table7FF[i]|=bits;
        }

        bits=1;                 // Lead byte 0xE0.
        for(i=0; i<32; ++i) {   // First half of 4k block.
            bmpBlockBits[i]|=bits;
        }

        mask= static_cast<uint32_t>(~(0x10001<<0xd));   // Lead byte 0xED.
        bits=1<<0xd;
        for(i=32; i<64; ++i) {  // Second half of 4k block.
            bmpBlockBits[i]=(bmpBlockBits[i]&mask)|bits;
        }
    } else {
        mask= static_cast<uint32_t>(~(0x10001<<0xd));   // Lead byte 0xED.
        for(i=32; i<64; ++i) {  // Second half of 4k block.
            bmpBlockBits[i]&=mask;
        }
    }
}